

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O0

void av1_inv_txfm_add_c(tran_low_t *dqcoeff,uint8_t *dst,int stride,TxfmParam *txfm_param)

{
  int iVar1;
  int iVar2;
  TxfmParam *in_RCX;
  int in_EDX;
  long in_RSI;
  tran_low_t *in_RDI;
  int c_1;
  int r_1;
  int c;
  int r;
  int h;
  int w;
  int tmp_stride;
  uint16_t tmp [4096];
  TX_SIZE tx_size;
  int local_207c;
  int local_2078;
  int local_2074;
  int local_2070;
  ushort local_2060 [4103];
  byte local_51;
  int local_44;
  long local_40;
  
  local_51 = in_RCX->tx_size;
  iVar1 = tx_size_wide[local_51];
  iVar2 = tx_size_high[local_51];
  for (local_2070 = 0; local_2070 < iVar2; local_2070 = local_2070 + 1) {
    for (local_2074 = 0; local_2074 < iVar1; local_2074 = local_2074 + 1) {
      local_2060[local_2070 * 0x40 + local_2074] =
           (ushort)*(byte *)(in_RSI + (local_2070 * in_EDX + local_2074));
    }
  }
  local_44 = in_EDX;
  local_40 = in_RSI;
  (*av1_highbd_inv_txfm_add)(in_RDI,(uint8_t *)((ulong)local_2060 >> 1),0x40,in_RCX);
  for (local_2078 = 0; local_2078 < iVar2; local_2078 = local_2078 + 1) {
    for (local_207c = 0; local_207c < iVar1; local_207c = local_207c + 1) {
      *(char *)(local_40 + (local_2078 * local_44 + local_207c)) =
           (char)local_2060[local_2078 * 0x40 + local_207c];
    }
  }
  return;
}

Assistant:

void av1_inv_txfm_add_c(const tran_low_t *dqcoeff, uint8_t *dst, int stride,
                        const TxfmParam *txfm_param) {
  const TX_SIZE tx_size = txfm_param->tx_size;
  DECLARE_ALIGNED(32, uint16_t, tmp[MAX_TX_SQUARE]);
  int tmp_stride = MAX_TX_SIZE;
  int w = tx_size_wide[tx_size];
  int h = tx_size_high[tx_size];
  for (int r = 0; r < h; ++r) {
    for (int c = 0; c < w; ++c) {
      tmp[r * tmp_stride + c] = dst[r * stride + c];
    }
  }

  av1_highbd_inv_txfm_add(dqcoeff, CONVERT_TO_BYTEPTR(tmp), tmp_stride,
                          txfm_param);

  for (int r = 0; r < h; ++r) {
    for (int c = 0; c < w; ++c) {
      dst[r * stride + c] = (uint8_t)tmp[r * tmp_stride + c];
    }
  }
}